

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmnet.h
# Opt level: O2

void __thiscall TadsServerThread::set_run_state(TadsServerThread *this,char *s)

{
  OS_Counter *pOVar1;
  StringRef *this_00;
  
  this_00 = (StringRef *)operator_new(0x28);
  StringRef::StringRef(this_00,s);
  set_run_state(this,this_00);
  LOCK();
  pOVar1 = &(this_00->super_CVmRefCntObj).cnt;
  (pOVar1->cnt).super___atomic_base<long>._M_i = (pOVar1->cnt).super___atomic_base<long>._M_i + -1;
  UNLOCK();
  if ((pOVar1->cnt).super___atomic_base<long>._M_i == 0) {
    (*(this_00->super_CVmRefCntObj)._vptr_CVmRefCntObj[1])(this_00);
    return;
  }
  return;
}

Assistant:

void set_run_state(const char *s)
    {
        /* set up a StringRef for the string */
        StringRef *r = new StringRef(s);

        /* set it as the new state */
        set_run_state(r);

        /* done with our reference to the new StringRef */
        r->release_ref();
    }